

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlChar *arg2;
  xmlChar *pxVar5;
  xmlRelaxNGValidErr err;
  uint uVar6;
  xmlRelaxNGDefinePtr pxVar7;
  bool bVar8;
  
  if ((define->name != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(elem->name,define->name), iVar2 == 0)
     ) {
    pxVar5 = define->name;
    arg2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
    goto LAB_00177395;
  }
  pxVar5 = define->ns;
  if ((pxVar5 == (xmlChar *)0x0) || (*pxVar5 == '\0')) {
    if ((elem->ns == (xmlNs *)0x0 || pxVar5 == (xmlChar *)0x0) || (define->name != (xmlChar *)0x0))
    {
      if ((elem->ns == (xmlNs *)0x0) || (pxVar5 = define->name, pxVar5 == (xmlChar *)0x0))
      goto LAB_00177322;
    }
    else {
      pxVar5 = elem->name;
    }
    err = XML_RELAXNG_ERR_ELEMEXTRANS;
  }
  else {
    if (elem->ns != (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(elem->ns->href,pxVar5);
      if (iVar2 == 0) {
        pxVar5 = elem->name;
        arg2 = define->ns;
        err = XML_RELAXNG_ERR_ELEMWRONGNS;
        goto LAB_00177395;
      }
LAB_00177322:
      pxVar7 = define->nameClass;
      if (pxVar7 == (xmlRelaxNGDefinePtr)0x0) {
        return 1;
      }
      if (pxVar7->type != XML_RELAXNG_CHOICE) {
        if (pxVar7->type != XML_RELAXNG_EXCEPT) {
          pp_Var3 = __xmlGenericError();
          p_Var1 = *pp_Var3;
          ppvVar4 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                    ,0x2624);
          return -1;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = ctxt->flags;
          ctxt->flags = uVar6 | 1;
        }
        for (pxVar7 = pxVar7->content; bVar8 = pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0, !bVar8;
            pxVar7 = pxVar7->next) {
          iVar2 = xmlRelaxNGElementMatch(ctxt,pxVar7,elem);
          if (iVar2 == 1) {
            iVar2 = 1;
            elem = (xmlNodePtr)0x0;
            goto LAB_00177494;
          }
          if (iVar2 < 0) goto LAB_0017746e;
        }
        iVar2 = 1;
        goto LAB_00177494;
      }
      if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = ctxt->flags;
        ctxt->flags = uVar6 | 1;
      }
      for (pxVar7 = pxVar7->nameClass; bVar8 = pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0, !bVar8;
          pxVar7 = pxVar7->next) {
        iVar2 = xmlRelaxNGElementMatch(ctxt,pxVar7,elem);
        if (iVar2 == 1) {
          elem = (xmlNodePtr)&DAT_00000001;
          iVar2 = 1;
          goto LAB_00177494;
        }
        if (iVar2 < 0) goto LAB_0017746e;
      }
      if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
        iVar2 = 0;
        goto LAB_001774a1;
      }
      if (ctxt->errNr < 1) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        xmlRelaxNGPopErrors(ctxt,0);
      }
      goto LAB_0017749d;
    }
    pxVar5 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNONS;
  }
  arg2 = (xmlChar *)0x0;
LAB_00177395:
  xmlRelaxNGAddValidError(ctxt,err,pxVar5,arg2,0);
  return 0;
LAB_0017746e:
  elem = (xmlNodePtr)0xffffffff;
  iVar2 = -1;
LAB_00177494:
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) goto LAB_001774a1;
LAB_0017749d:
  ctxt->flags = uVar6;
LAB_001774a1:
  if (bVar8) {
    return iVar2;
  }
  return (int)elem;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        TODO ret = -1;
    }
    return (ret);
}